

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_lc.c
# Opt level: O0

int inver_order(int *list,int n)

{
  int local_20;
  int local_1c;
  int j;
  int i;
  int ret;
  int n_local;
  int *list_local;
  
  j = 0;
  for (local_1c = 1; local_1c < n; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
      if (list[local_1c] < list[local_20]) {
        j = j + 1;
      }
    }
  }
  return j;
}

Assistant:

int inver_order(int list[], int n) {
    int ret = 0;
    for (int i = 1; i < n; i++)
        for (int j = 0; j < i; j++)
            if (list[j] > list[i])
                ret++;
    return ret;
}